

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwaLookups.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_27d8::LutHeaderWorker::run(LutHeaderWorker *this,bool outputProgress)

{
  half h;
  unkuint9 Var1;
  FILE *__stream;
  unsigned_short uVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  byte in_SIL;
  LutHeaderWorker *in_RDI;
  float fVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  int i_2;
  half tmp;
  int jCnt;
  int iCnt;
  int j;
  int i_1;
  half tmpHalf;
  int i;
  bool valueFound;
  int targetNumSetBits;
  half closestHalf;
  half inputHalf;
  int numSetBits;
  size_t input;
  int candidateCount;
  half candidate [16];
  half *local_88;
  int local_80;
  int local_6c;
  int local_68;
  half local_5e;
  int local_5c;
  byte local_55;
  int local_54;
  half local_50;
  half local_4e;
  int local_4c;
  ulong local_48;
  int local_3c;
  half local_38 [16];
  half ahStack_18 [7];
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_88 = local_38;
  do {
    half::half(local_88);
    local_88 = local_88 + 1;
  } while (local_88 != ahStack_18);
  local_3c = 0;
  for (local_48 = in_RDI->_startValue; __stream = _stderr, local_48 < in_RDI->_endValue;
      local_48 = local_48 + 1) {
    if (((local_9 & 1) != 0) && (local_48 % 100 == 0)) {
      Var1 = (unkuint9)local_48;
      sVar5 = numValues(in_RDI);
      fprintf(__stream," Building acceleration for DwaCompressor, %.2f %%      %c",
              ((double)(unkint9)Var1 * 100.0) / (double)sVar5,0xd);
    }
    local_4c = countSetBits(in_RDI,(unsigned_short)local_48);
    half::half(&local_4e);
    half::half(&local_50);
    half::setBits(&local_4e,(unsigned_short)local_48);
    in_RDI->_offset[local_48 - in_RDI->_startValue] = in_RDI->_numElements;
    local_3c = 0;
    local_54 = local_4c;
    while (local_54 = local_54 + -1, -1 < local_54) {
      local_55 = 0;
      for (local_5c = 0; local_5c < 0x10000; local_5c = local_5c + 1) {
        iVar3 = countSetBits(in_RDI,(unsigned_short)local_5c);
        if (iVar3 == local_54) {
          if ((local_55 & 1) == 0) {
            half::setBits(&local_50,(unsigned_short)local_5c);
            local_55 = 1;
          }
          else {
            half::half(&local_5e);
            half::setBits(&local_5e,(unsigned_short)local_5c);
            fVar6 = half::operator_cast_to_float(&local_4e);
            fVar7 = half::operator_cast_to_float(&local_5e);
            dVar8 = std::fabs((double)(ulong)(uint)(fVar6 - fVar7));
            fVar6 = half::operator_cast_to_float(&local_4e);
            fVar7 = half::operator_cast_to_float(&local_50);
            dVar9 = std::fabs((double)(ulong)(uint)(fVar6 - fVar7));
            if (SUB84(dVar8,0) < SUB84(dVar9,0)) {
              half::operator=(&local_50,local_5e);
            }
          }
        }
      }
      if ((local_55 & 1) == 0) {
        fprintf(_stderr,"bork bork bork!\n");
      }
      half::operator=(local_38 + local_3c,local_50);
      local_3c = local_3c + 1;
    }
    for (local_68 = 0; local_6c = local_68, local_68 < local_3c; local_68 = local_68 + 1) {
      while (local_6c = local_6c + 1, local_6c < local_3c) {
        uVar2 = half::bits(local_38 + local_68);
        iVar3 = countSetBits(in_RDI,uVar2);
        uVar2 = half::bits(local_38 + local_6c);
        iVar4 = countSetBits(in_RDI,uVar2);
        if (iVar4 < iVar3) {
          h._h = local_38[local_68]._h;
          half::operator=(local_38 + local_68,(half)local_38[local_6c]._h);
          half::operator=(local_38 + local_6c,h);
        }
      }
    }
    for (local_80 = 0; local_80 < local_3c; local_80 = local_80 + 1) {
      uVar2 = half::bits(local_38 + local_80);
      in_RDI->_elements[in_RDI->_numElements] = uVar2;
      in_RDI->_numElements = in_RDI->_numElements + 1;
    }
    if (local_48 == in_RDI->_endValue - 1) {
      in_RDI->_lastCandidateCount = (long)local_3c;
    }
  }
  return;
}

Assistant:

void run(bool outputProgress)
            {
                half candidate[16];
                int  candidateCount = 0;

                for (size_t input=_startValue; input<_endValue; ++input) {

                    if (outputProgress) {
#ifdef __GNUC__
                        if (input % 100 == 0) {
                            fprintf(stderr, 
                            " Building acceleration for DwaCompressor, %.2f %%      %c",
                                          100.*(float)input/(float)numValues(), 13);
                        }
#else
                        if (input % 1000 == 0) {
                            fprintf(stderr, 
                            " Building acceleration for DwaCompressor, %.2f %%\n",
                                          100.*(float)input/(float)numValues());
                        }
#endif
                    } 

                    
                    int  numSetBits = countSetBits(input);
                    half inputHalf, closestHalf;

                    inputHalf.setBits(input);

                    _offset[input - _startValue] = _numElements;

                    // Gather candidates
                    candidateCount = 0;
                    for (int targetNumSetBits=numSetBits-1; targetNumSetBits>=0;
                                                           --targetNumSetBits) {
                        bool valueFound = false;

                        for (int i=0; i<65536; ++i) {
                            if (countSetBits(i) != targetNumSetBits) continue;

                            if (!valueFound) {
                                closestHalf.setBits(i);
                                valueFound = true;
                            } else {
                                half tmpHalf;

                                tmpHalf.setBits(i);

                                if (fabs((float)inputHalf - (float)tmpHalf) < 
                                    fabs((float)inputHalf - (float)closestHalf)) {
                                    closestHalf = tmpHalf;
                                }
                            }
                        }

                        if (valueFound == false) {
                            fprintf(stderr, "bork bork bork!\n");
                        }       

                        candidate[candidateCount] = closestHalf;
                        candidateCount++;
                    }

                    // Sort candidates by increasing number of bits set
                    for (int i=0; i<candidateCount; ++i) {
                        for (int j=i+1; j<candidateCount; ++j) {

                            int   iCnt = countSetBits(candidate[i].bits());
                            int   jCnt = countSetBits(candidate[j].bits());

                            if (jCnt < iCnt) {
                                half tmp     = candidate[i];
                                candidate[i] = candidate[j];
                                candidate[j] = tmp;
                            }
                        }
                    }

                    // Copy candidates to the data buffer;
                    for (int i=0; i<candidateCount; ++i) {
                        _elements[_numElements] = candidate[i].bits();
                        _numElements++;
                    }

                    if (input == _endValue-1) {
                        _lastCandidateCount = candidateCount;
                    }
                }
            }